

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  Edition EVar1;
  ushort *puVar2;
  FeatureSet *pFVar3;
  FieldDescriptor *pFVar4;
  OneofDescriptor *this_00;
  ReservedRange *pRVar5;
  AllocatedData AVar6;
  undefined8 uVar7;
  DebugStringOptions *debug_string_options_00;
  bool bVar8;
  int iVar9;
  Nonnull<char_*> pcVar10;
  ulong uVar11;
  Nonnull<const_char_*> pcVar12;
  FieldDescriptor *pFVar13;
  anon_union_8_1_a8a14541_for_iterator_2 *paVar14;
  SymbolVisibility *visibility;
  char *pcVar15;
  long lVar16;
  long lVar17;
  undefined4 in_register_00000034;
  long lVar18;
  int depth_00;
  AllocatedData AVar19;
  size_t in_R9;
  iterator iVar20;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view src;
  string_view format_10;
  string_view format_11;
  string prefix;
  ExtensionRangeOptions range_options;
  string formatted_options;
  SourceLocationCommentPrinter comment_printer;
  MessageOptions full_options;
  AllocatedData local_2a8;
  AllocatedData local_2a0;
  undefined1 local_298 [16];
  AlphaNum local_288;
  undefined8 local_250;
  anon_union_8_1_a8a14541_for_iterator_2 local_248 [2];
  anon_union_96_1_493b367e_for_ExtensionRangeOptions_9 local_238;
  DebugStringOptions *local_1d8;
  string *local_1d0;
  undefined1 local_1c8 [32];
  AllocatedData local_1a8;
  AllocatedData AStack_1a0;
  AllocatedData local_198;
  char *local_190;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_170;
  undefined1 local_150 [120];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  MessageOptions local_b8;
  AlphaNum local_60;
  
  local_250 = CONCAT44(in_register_00000034,depth);
  if ((this->options_->field_0)._impl_.map_entry_ == false) {
    local_2a8.flat = (KeyValue *)local_298;
    std::__cxx11::string::_M_construct((ulong)&local_2a8,(char)depth * '\x02');
    local_150._24_8_ = local_150 + 0x28;
    local_150._32_8_ = 0;
    local_150[0x28] = '\0';
    local_150._56_8_ = local_150 + 0x48;
    local_150._64_8_ = 0;
    local_150[0x48] = '\0';
    local_150._88_8_ = (pointer)0x0;
    local_150._96_8_ = (pointer)0x0;
    local_150._104_8_ = (pointer)0x0;
    local_150[0x70] = debug_string_options->include_comments;
    local_150[0x71] = debug_string_options->elide_group_body;
    local_150[0x72] = debug_string_options->elide_oneof_body;
    local_d8._M_p = (pointer)&local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_2a8.flat,
               (undefined1 *)
               ((long)(&((local_2a8.flat)->second).cached_size + 0xfffffffffffffffb) +
               (long)(&((local_2a0.flat)->second).cached_size + -5)));
    uVar7 = local_250;
    if (debug_string_options->include_comments == true) {
      local_150[0] = GetSourceLocation(this,(SourceLocation *)(local_150 + 8));
    }
    else {
      local_150[0] = false;
    }
    anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)local_150,contents);
    AVar6 = local_2a0;
    AVar19 = local_2a8;
    if (include_opening_clause) {
      protobuf::(anonymous_namespace)::VisibilityToKeyword_abi_cxx11_
                ((string *)&local_b8,(_anonymous_namespace_ *)(ulong)((byte)this->field_0x2 & 3),
                 visibility);
      puVar2 = (ushort *)(this->all_names_).payload_;
      local_238._18_6_ = 0;
      local_238._16_2_ = *puVar2;
      local_248[0].slot_ = (slot_type *)AVar6;
      local_248[1].slot_ = (slot_type *)AVar19;
      local_238._impl_._extensions_.arena_ =
           (Arena *)local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_;
      local_238._8_8_ = local_b8.super_Message.super_MessageLite._vptr_MessageLite;
      local_238._24_8_ = (long)puVar2 + ~(ulong)local_238._impl_._extensions_.map_;
      format._M_str = (char *)local_248;
      format._M_len = (size_t)"$0$1message $2";
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)contents,(Nonnull<std::string_*>)0xe,format,
                 (Nullable<const_absl::string_view_*>)0x3,in_R9);
      if ((anon_union_72_1_493b367e_for_MessageOptions_3 *)
          local_b8.super_Message.super_MessageLite._vptr_MessageLite != &local_b8.field_0) {
        operator_delete(local_b8.super_Message.super_MessageLite._vptr_MessageLite,
                        (ulong)((long)&((local_b8.field_0._impl_._extensions_.arena_)->impl_).
                                       tag_and_id_ + 1));
      }
    }
    std::__cxx11::string::append((char *)contents);
    MessageOptions::MessageOptions(&local_b8,(Arena *)0x0,this->options_);
    pFVar3 = this->proto_features_;
    local_1d8 = debug_string_options;
    if (pFVar3 != (FeatureSet *)_FeatureSet_default_instance_) {
      local_b8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
           local_b8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
      if (local_b8.field_0._impl_.features_ == (FeatureSet *)0x0) {
        if ((local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
          local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_ =
               *(undefined8 *)
                (local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                0xfffffffffffffffe);
        }
        local_b8.field_0._impl_.features_ =
             (FeatureSet *)
             Arena::DefaultConstruct<google::protobuf::FeatureSet>
                       ((Arena *)local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_);
      }
      FeatureSet::CopyFrom(local_b8.field_0._impl_.features_,pFVar3);
    }
    depth_00 = (int)uVar7 + 1;
    anon_unknown_24::FormatLineOptions(depth_00,&local_b8.super_Message,this->file_->pool_,contents)
    ;
    local_170.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 1;
    local_170.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    iVar9 = this->field_count_;
    if (0 < iVar9) {
      lVar17 = 0;
      lVar16 = 0;
      do {
        if (((int)this->file_->edition_ < 1000) && ((&this->fields_->type_)[lVar17] == '\n')) {
          local_1a8.flat =
               (KeyValue *)
               FieldDescriptor::message_type
                         ((FieldDescriptor *)(&this->fields_->super_SymbolBase + lVar17));
          local_288.piece_._M_len = (size_t)&local_170;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                      *)local_248,&local_288,(Descriptor **)&local_1a8.flat,
                     (Descriptor **)&local_1a8);
          iVar9 = this->field_count_;
        }
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + 0x58;
      } while (lVar16 < iVar9);
    }
    iVar9 = this->extension_count_;
    if (0 < iVar9) {
      lVar17 = 0;
      lVar16 = 0;
      do {
        if (((int)this->file_->edition_ < 1000) && ((&this->extensions_->type_)[lVar17] == '\n')) {
          local_1a8.flat =
               (KeyValue *)
               FieldDescriptor::message_type
                         ((FieldDescriptor *)(&this->extensions_->super_SymbolBase + lVar17));
          local_288.piece_._M_len = (size_t)&local_170;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                      *)local_248,&local_288,(Descriptor **)&local_1a8.flat,
                     (Descriptor **)&local_1a8);
          iVar9 = this->extension_count_;
        }
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + 0x58;
      } while (lVar16 < iVar9);
    }
    if (0 < this->nested_type_count_) {
      lVar17 = 0;
      lVar16 = 0;
      do {
        local_248[0].slot_ = (slot_type *)(&this->nested_types_->super_SymbolBase + lVar17);
        iVar20 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
                 ::find<google::protobuf::Descriptor_const*>
                           ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
                             *)&local_170,
                            (key_arg<const_google::protobuf::Descriptor_*> *)&local_248[0].slot_);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::AssertNotDebugCapacity(&local_170);
        if (iVar20.ctrl_ == (ctrl_t *)0x0) {
          if (this->nested_type_count_ <= lVar16) {
            pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar16,(long)this->nested_type_count_,"index < nested_type_count()"
                                );
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_248,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa8a,pcVar12);
            goto LAB_00214a5a;
          }
          DebugString((Descriptor *)(&this->nested_types_->super_SymbolBase + lVar17),depth_00,
                      contents,local_1d8,true);
        }
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + 0xa0;
      } while (lVar16 < this->nested_type_count_);
    }
    debug_string_options_00 = local_1d8;
    if (0 < this->enum_type_count_) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        EnumDescriptor::DebugString
                  ((EnumDescriptor *)(&this->enum_types_->super_SymbolBase + lVar16),depth_00,
                   contents,debug_string_options_00);
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x58;
      } while (lVar17 < this->enum_type_count_);
    }
    if (0 < this->field_count_) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        pFVar4 = this->fields_;
        if (((&pFVar4->field_0x3)[lVar16] & 1) == 0) {
          FieldDescriptor::DebugString
                    ((FieldDescriptor *)(&pFVar4->super_SymbolBase + lVar16),depth_00,contents,
                     debug_string_options_00);
        }
        else {
          if (((&pFVar4->field_0x1)[lVar16] & 0x10) == 0) {
            iVar9 = 0xb63;
LAB_00214a7c:
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,iVar9);
          }
          this_00 = *(OneofDescriptor **)((long)&pFVar4->scope_ + lVar16);
          if (this_00 == (OneofDescriptor *)0x0) {
            iVar9 = 0xb31;
            goto LAB_00214a7c;
          }
          iVar9 = this_00->field_count_;
          if ((long)iVar9 == 1) {
            pFVar13 = this_00->fields_;
            if ((pFVar13->field_0x1 & 2) != 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_248,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb64,"!res->is_synthetic()");
              goto LAB_00214a5a;
            }
          }
          else {
            if (iVar9 < 1) {
              pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (0,(long)iVar9,"index < field_count()");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_248,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xab3,pcVar12);
              goto LAB_00214a5a;
            }
            pFVar13 = this_00->fields_;
          }
          if ((FieldDescriptor *)(&pFVar4->super_SymbolBase + lVar16) == pFVar13) {
            OneofDescriptor::DebugString(this_00,depth_00,contents,debug_string_options_00);
          }
        }
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x58;
      } while (lVar17 < this->field_count_);
    }
    local_1d0 = contents;
    if (0 < this->extension_range_count_) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        AVar6 = local_2a0;
        AVar19 = local_2a8;
        pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                            (*(int32_t *)((long)&this->extension_ranges_->start_ + lVar16),
                             (Nonnull<char_*>)&local_238);
        local_288.digits_._0_8_ = pcVar10 + -(long)&local_238;
        local_288.piece_._M_len = (size_t)AVar6;
        local_288.piece_._M_str = (char *)AVar19;
        format_00._M_str = (char *)&local_288;
        format_00._M_len = (size_t)"$0  extensions $1";
        local_288.digits_._8_8_ = (KeyValue *)&local_238;
        local_248[0] = (anon_union_8_1_a8a14541_for_iterator_2)local_288.digits_._0_8_;
        local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)&local_238;
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)local_1d0,(Nonnull<std::string_*>)0x11,format_00,
                   (Nullable<const_absl::string_view_*>)0x2,in_R9);
        contents = local_1d0;
        lVar18 = (long)this->extension_range_count_;
        if (lVar18 <= lVar17) {
          pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar17,lVar18,"index < extension_range_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_248,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa94,pcVar12);
          goto LAB_00214a5a;
        }
        iVar9 = *(int *)((long)&this->extension_ranges_->end_ + lVar16);
        if (*(int *)((long)&this->extension_ranges_->start_ + lVar16) + 1 < iVar9) {
          pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                              (iVar9 + -1,(Nonnull<char_*>)&local_238);
          local_288.piece_._M_len = (size_t)(pcVar10 + -(long)&local_238);
          format_01._M_str = (char *)&local_288;
          format_01._M_len = (size_t)" to $0";
          local_288.piece_._M_str = (char *)&local_238;
          local_248[0] = (anon_union_8_1_a8a14541_for_iterator_2)local_288.piece_._M_len;
          local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)&local_238;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)contents,(Nonnull<std::string_*>)&DAT_00000006,format_01
                     ,(Nullable<const_absl::string_view_*>)0x1,in_R9);
          lVar18 = (long)this->extension_range_count_;
        }
        if (lVar18 <= lVar17) {
          pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar17,lVar18,"index < extension_range_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_288,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa94,pcVar12);
LAB_00214989:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_288);
        }
        ExtensionRangeOptions::ExtensionRangeOptions
                  ((ExtensionRangeOptions *)local_248,(Arena *)0x0,
                   *(ExtensionRangeOptions **)((long)&this->extension_ranges_->options_ + lVar16));
        if (this->extension_range_count_ <= lVar17) {
          pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar17,(long)this->extension_range_count_,
                               "index < extension_range_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_288,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa94,pcVar12);
          goto LAB_00214989;
        }
        pFVar3 = *(FeatureSet **)((long)&this->extension_ranges_->proto_features_ + lVar16);
        if (pFVar3 != (FeatureSet *)_FeatureSet_default_instance_) {
          local_238._24_8_ = local_238._24_8_ | 1;
          if (local_238._impl_.features_ == (FeatureSet *)0x0) {
            AVar19 = (AllocatedData)local_248[1];
            if (((ulong)local_248[1].slot_ & 1) != 0) {
              AVar19 = (AllocatedData)
                       ((AllocatedData *)((ulong)local_248[1].slot_ & 0xfffffffffffffffe))->flat;
            }
            local_238._impl_.features_ =
                 (FeatureSet *)
                 Arena::DefaultConstruct<google::protobuf::FeatureSet>((Arena *)AVar19.flat);
          }
          FeatureSet::CopyFrom(local_238._impl_.features_,pFVar3);
        }
        local_1c8._0_8_ = local_1c8 + 0x10;
        local_1c8._8_8_ = (anon_union_96_1_493b367e_for_ExtensionRangeOptions_9 *)0x0;
        local_1c8[0x10] = '\0';
        bVar8 = anon_unknown_24::FormatBracketedOptions
                          (depth_00,(Message *)local_248,this->file_->pool_,(string *)local_1c8);
        if (bVar8) {
          local_288.piece_._M_len = 2;
          local_288.piece_._M_str = (char *)((long)"EXTERNAL [" + 8);
          local_1a8.flat = (KeyValue *)local_1c8._8_8_;
          AStack_1a0.flat = (KeyValue *)local_1c8._0_8_;
          local_60.piece_._M_len = 1;
          local_60.piece_._M_str = "]";
          absl::lts_20250127::StrAppend(contents,&local_288,(AlphaNum *)&local_1a8,&local_60);
        }
        local_288.piece_._M_len = 2;
        local_288.piece_._M_str = ";\n";
        absl::lts_20250127::StrAppend(contents,&local_288);
        if ((anon_union_96_1_493b367e_for_ExtensionRangeOptions_9 *)local_1c8._0_8_ !=
            (anon_union_96_1_493b367e_for_ExtensionRangeOptions_9 *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,CONCAT71(local_1c8._17_7_,local_1c8[0x10]) + 1);
        }
        ExtensionRangeOptions::~ExtensionRangeOptions((ExtensionRangeOptions *)local_248);
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x28;
      } while (lVar17 < this->extension_range_count_);
    }
    uVar11 = (ulong)(uint)this->extension_count_;
    if (0 < this->extension_count_) {
      local_250 = ZEXT48((int)local_250 + 2);
      lVar17 = 0;
      lVar18 = 0;
      lVar16 = 0;
      do {
        iVar9 = (int)uVar11;
        if (*(long *)((long)&this->extensions_->containing_type_ + lVar17) != lVar16) {
          if (lVar18 != 0) {
            local_248[0] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a0;
            local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a8;
            format_02._M_str = (char *)local_248;
            format_02._M_len = (size_t)"$0  }\n";
            absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                      ((substitute_internal *)contents,(Nonnull<std::string_*>)&DAT_00000006,
                       format_02,(Nullable<const_absl::string_view_*>)0x1,in_R9);
            iVar9 = this->extension_count_;
          }
          if (iVar9 <= lVar18) {
            pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar18,(long)iVar9,"index < extension_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_248,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa95,pcVar12);
LAB_00214a5a:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)local_248);
          }
          lVar16 = *(long *)((long)&this->extensions_->containing_type_ + lVar17);
          local_238._impl_._extensions_.arena_ =
               (Arena *)(ulong)*(ushort *)(*(long *)(lVar16 + 0x10) + 2);
          local_248[0] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a0;
          local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a8;
          local_238._8_8_ = ~(ulong)local_238._impl_._extensions_.arena_ + *(long *)(lVar16 + 0x10);
          format_03._M_str = (char *)local_248;
          format_03._M_len = (size_t)"$0  extend .$1 {\n";
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)contents,(Nonnull<std::string_*>)0x11,format_03,
                     (Nullable<const_absl::string_view_*>)0x2,in_R9);
          iVar9 = this->extension_count_;
        }
        if (iVar9 <= lVar18) {
          pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar18,(long)iVar9,"index < extension_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_248,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa95,pcVar12);
          goto LAB_00214a5a;
        }
        FieldDescriptor::DebugString
                  ((FieldDescriptor *)(&this->extensions_->super_SymbolBase + lVar17),(int)local_250
                   ,contents,local_1d8);
        lVar18 = lVar18 + 1;
        uVar11 = (ulong)this->extension_count_;
        lVar17 = lVar17 + 0x58;
      } while (lVar18 < (long)uVar11);
      if (0 < this->extension_count_) {
        local_248[0] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a0;
        local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a8;
        format_04._M_str = (char *)local_248;
        format_04._M_len = (size_t)"$0  }\n";
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)contents,(Nonnull<std::string_*>)&DAT_00000006,format_04,
                   (Nullable<const_absl::string_view_*>)0x1,in_R9);
      }
    }
    if (0 < this->reserved_range_count_) {
      local_248[0] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a0;
      local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a8;
      format_05._M_str = (char *)local_248;
      format_05._M_len = (size_t)"$0  reserved ";
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)contents,(Nonnull<std::string_*>)0xd,format_05,
                 (Nullable<const_absl::string_view_*>)0x1,in_R9);
      if (0 < this->reserved_range_count_) {
        pcVar15 = local_288.digits_;
        lVar16 = 0;
        do {
          pRVar5 = this->reserved_ranges_;
          iVar9 = pRVar5[lVar16].start;
          if (pRVar5[lVar16].end == iVar9 + 1) {
            pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                                (iVar9,(Nonnull<char_*>)&local_238);
            local_288.piece_._M_len = (size_t)(pcVar10 + -(long)&local_238);
            format_06._M_str = (char *)&local_288;
            format_06._M_len = (size_t)"$0, ";
            local_288.piece_._M_str = (char *)&local_238;
            local_248[0] = (anon_union_8_1_a8a14541_for_iterator_2)local_288.piece_._M_len;
            local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)&local_238;
            absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                      ((substitute_internal *)contents,(Nonnull<std::string_*>)0x4,format_06,
                       (Nullable<const_absl::string_view_*>)0x1,in_R9);
          }
          else if (pRVar5[lVar16].end < 0x20000000) {
            pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                                (iVar9,(Nonnull<char_*>)&local_238);
            local_248[0].slot_ = (slot_type *)(pcVar10 + -(long)&local_238);
            local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)&local_238;
            pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                                (pRVar5[lVar16].end + -1,pcVar15);
            local_288.piece_._M_len = (size_t)(pcVar10 + -(long)pcVar15);
            local_1a8.flat = (KeyValue *)local_248[0];
            AStack_1a0.flat = (KeyValue *)local_248[1];
            format_08._M_str = (char *)&local_1a8;
            format_08._M_len = (size_t)"$0 to $1, ";
            local_288.piece_._M_str = pcVar15;
            local_198.flat = (KeyValue *)local_288.piece_._M_len;
            local_190 = pcVar15;
            absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                      ((substitute_internal *)contents,(Nonnull<std::string_*>)0xa,format_08,
                       (Nullable<const_absl::string_view_*>)0x2,in_R9);
          }
          else {
            pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                                (iVar9,(Nonnull<char_*>)&local_238);
            local_288.piece_._M_len = (size_t)(pcVar10 + -(long)&local_238);
            format_07._M_str = (char *)&local_288;
            format_07._M_len = (size_t)"$0 to max, ";
            local_288.piece_._M_str = (char *)&local_238;
            local_248[0] = (anon_union_8_1_a8a14541_for_iterator_2)local_288.piece_._M_len;
            local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)&local_238;
            absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                      ((substitute_internal *)contents,(Nonnull<std::string_*>)0xb,format_07,
                       (Nullable<const_absl::string_view_*>)0x1,in_R9);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < this->reserved_range_count_);
      }
      std::__cxx11::string::replace
                ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x3e139e);
    }
    if (0 < this->reserved_name_count_) {
      paVar14 = local_248;
      local_248[0] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a0;
      local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a8;
      format_09._M_str = (char *)paVar14;
      format_09._M_len = (size_t)"$0  reserved ";
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)contents,(Nonnull<std::string_*>)0xd,format_09,
                 (Nullable<const_absl::string_view_*>)0x1,in_R9);
      if (0 < this->reserved_name_count_) {
        lVar16 = 0;
        do {
          EVar1 = this->file_->edition_;
          src._M_str = (char *)paVar14;
          src._M_len = (size_t)(this->reserved_names_[lVar16]->_M_dataplus)._M_p;
          absl::lts_20250127::CEscape_abi_cxx11_
                    ((string *)local_248,
                     (lts_20250127 *)this->reserved_names_[lVar16]->_M_string_length,src);
          contents = local_1d0;
          pcVar15 = "$0, ";
          if ((int)EVar1 < 1000) {
            pcVar15 = "\"$0\", ";
          }
          local_288.piece_._M_len = (size_t)local_248[1];
          local_288.piece_._M_str = (char *)local_248[0];
          format_10._M_str = (char *)&local_288;
          format_10._M_len = (size_t)pcVar15;
          paVar14 = (anon_union_8_1_a8a14541_for_iterator_2 *)&local_288;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)local_1d0,
                     (Nonnull<std::string_*>)((ulong)((int)EVar1 < 1000) * 2 + 4),format_10,
                     (Nullable<const_absl::string_view_*>)0x1,in_R9);
          if ((anon_union_96_1_493b367e_for_ExtensionRangeOptions_9 *)local_248[0].slot_ !=
              &local_238) {
            operator_delete(local_248[0].slot_,
                            (ulong)((long)&((local_238._impl_._extensions_.arena_)->impl_).
                                           tag_and_id_ + 1));
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < this->reserved_name_count_);
      }
      std::__cxx11::string::replace
                ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x3e139e);
    }
    local_248[0] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a0;
    local_248[1] = (anon_union_8_1_a8a14541_for_iterator_2)local_2a8;
    format_11._M_str = (char *)local_248;
    format_11._M_len = (size_t)"$0}\n";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)contents,(Nonnull<std::string_*>)0x4,format_11,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
    anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)local_150,contents);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::destructor_impl(&local_170);
    MessageOptions::~MessageOptions(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_150 + 0x58));
    if ((undefined1 *)local_150._56_8_ != local_150 + 0x48) {
      operator_delete((void *)local_150._56_8_,CONCAT71(local_150._73_7_,local_150[0x48]) + 1);
    }
    if ((undefined1 *)local_150._24_8_ != local_150 + 0x28) {
      operator_delete((void *)local_150._24_8_,CONCAT71(local_150._41_7_,local_150[0x28]) + 1);
    }
    if ((anon_union_96_1_493b367e_for_ExtensionRangeOptions_9 *)local_2a8.flat !=
        (anon_union_96_1_493b367e_for_ExtensionRangeOptions_9 *)local_298) {
      operator_delete(local_2a8.flat,
                      (ulong)((long)&((ThreadSafeArena *)local_298._0_8_)->tag_and_id_ + 1));
    }
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, std::string* contents,
                             const DebugStringOptions& debug_string_options,
                             bool include_opening_clause) const {
  if (options().map_entry()) {
    // Do not generate debug string for auto-generated map-entry type.
    return;
  }
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  if (include_opening_clause) {
    absl::SubstituteAndAppend(contents, "$0$1message $2", prefix,
                              VisibilityToKeyword(visibility_keyword()),
                              name());
  }
  contents->append(" {\n");

  MessageOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  FormatLineOptions(depth, full_options, file()->pool(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  absl::flat_hash_set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (IsGroupSyntax(file()->edition(), field(i))) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (IsGroupSyntax(file()->edition(), extension(i))) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (!groups.contains(nested_type(i))) {
      nested_type(i)->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ true);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents, debug_string_options);
  }
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->real_containing_oneof() == nullptr) {
      field(i)->DebugString(depth, contents, debug_string_options);
    } else if (field(i)->containing_oneof()->field(0) == field(i)) {
      // This is the first field in this oneof, so print the whole oneof.
      field(i)->containing_oneof()->DebugString(depth, contents,
                                                debug_string_options);
    }
  }

  for (int i = 0; i < extension_range_count(); i++) {
    absl::SubstituteAndAppend(contents, "$0  extensions $1", prefix,
                              extension_range(i)->start_number());
    if (extension_range(i)->end_number() >
        extension_range(i)->start_number() + 1) {
      absl::SubstituteAndAppend(contents, " to $0",
                                extension_range(i)->end_number() - 1);
    }
    ExtensionRangeOptions range_options = extension_range(i)->options();
    CopyFeaturesToOptions(extension_range(i)->proto_features_, &range_options);
    std::string formatted_options;
    if (FormatBracketedOptions(depth, range_options, file()->pool(),
                               &formatted_options)) {
      absl::StrAppend(contents, " [", formatted_options, "]");
    }
    absl::StrAppend(contents, ";\n");
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) absl::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      absl::SubstituteAndAppend(contents, "$0  extend .$1 {\n", prefix,
                                containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, contents, debug_string_options);
  }
  if (extension_count() > 0)
    absl::SubstituteAndAppend(contents, "$0  }\n", prefix);

  if (reserved_range_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const Descriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start + 1) {
        absl::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end > FieldDescriptor::kMaxNumber) {
        absl::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        absl::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end - 1);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      absl::SubstituteAndAppend(
          contents,
          file()->edition() < Edition::EDITION_2023 ? "\"$0\", " : "$0, ",
          absl::CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  absl::SubstituteAndAppend(contents, "$0}\n", prefix);
  comment_printer.AddPostComment(contents);
}